

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<char,char,char>
          (StringTree *__return_storage_ptr__,kj *this,char *params,char *params_1,char *params_2)

{
  char *pcVar1;
  FixedArray<char,_1UL> local_2b;
  FixedArray<char,_1UL> local_2a;
  char local_29 [1];
  char *local_28;
  char *params_local_2;
  char *params_local_1;
  char *params_local;
  
  local_28 = params_1;
  params_local_2 = params;
  params_local_1 = (char *)this;
  params_local = (char *)__return_storage_ptr__;
  pcVar1 = fwd<char>((NoInfer<char> *)this);
  local_29[0] = (char)_::toStringTreeOrCharSequence<char>(pcVar1);
  pcVar1 = fwd<char>(params_local_2);
  local_2a = _::toStringTreeOrCharSequence<char>(pcVar1);
  pcVar1 = fwd<char>(local_28);
  local_2b = _::toStringTreeOrCharSequence<char>(pcVar1);
  StringTree::concat<kj::FixedArray<char,1ul>,kj::FixedArray<char,1ul>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(StringTree *)local_29,&local_2a,&local_2b,
             (FixedArray<char,_1UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}